

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

void wwTrimLo(word *a,size_t n,size_t pos)

{
  sbyte sVar1;
  size_t i;
  size_t pos_local;
  size_t n_local;
  word *a_local;
  
  i = pos >> 6;
  if (i < n) {
    if ((pos & 0x3f) != 0) {
      sVar1 = (sbyte)(pos & 0x3f);
      a[i] = a[i] >> sVar1;
      a[i] = a[i] << sVar1;
    }
  }
  else if (n < i) {
    i = n;
  }
  while (i != 0) {
    a[i - 1] = 0;
    i = i - 1;
  }
  return;
}

Assistant:

void wwTrimLo(word a[], size_t n, size_t pos)
{
	size_t i = pos / B_PER_W;
	ASSERT(wwIsValid(a, n));
	if (i < n)
	{
		// очистить биты слова a[i]
		if (pos %= B_PER_W)
			a[i] >>= pos, a[i] <<= pos;
	}
	else if (i > n)
		i = n;
	// очистить остальные слова
	while (i)
		a[--i] = 0;
}